

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O0

void __thiscall duckdb_tdigest::Centroid::add(Centroid *this,Centroid *c)

{
  Centroid *c_local;
  Centroid *this_local;
  
  if ((this->weight_ != 0.0) || (NAN(this->weight_))) {
    this->weight_ = c->weight_ + this->weight_;
    this->mean_ = (c->weight_ * (c->mean_ - this->mean_)) / this->weight_ + this->mean_;
  }
  else {
    this->weight_ = c->weight_;
    this->mean_ = c->mean_;
  }
  return;
}

Assistant:

inline void add(const Centroid &c) {
		//    CHECK_GT(c.weight_, 0);
		if (weight_ != 0.0) {
			weight_ += c.weight_;
			mean_ += c.weight_ * (c.mean_ - mean_) / weight_;
		} else {
			weight_ = c.weight_;
			mean_ = c.mean_;
		}
	}